

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledI2C.cxx
# Opt level: O1

void __thiscall SSD1306::OledI2C::fillWith(OledI2C *this,uint8_t value)

{
  uchar *puVar1;
  array<SSD1306::OledI2C::PixelBlock,_32UL> *paVar2;
  long lVar3;
  long lVar4;
  
  paVar2 = &this->blocks_;
  puVar1 = (this->blocks_)._M_elems[0].bytes_._M_elems + 1;
  lVar3 = 0x38;
  do {
    lVar4 = 0;
    do {
      if ((puVar1[lVar4] != value) && (puVar1[lVar4] = value, paVar2->_M_elems[0].dirty_ == false))
      {
        paVar2->_M_elems[0].dirty_ = true;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x20);
    paVar2 = (array<SSD1306::OledI2C::PixelBlock,_32UL> *)
             ((this->blocks_)._M_elems[0].bytes_._M_elems + lVar3 + -0x16);
    lVar3 = lVar3 + 0x22;
    puVar1 = puVar1 + 0x22;
  } while (lVar3 != 0x478);
  return;
}

Assistant:

void
SSD1306::OledI2C::fillWith(
    uint8_t value)
{
    for (auto& block : blocks_)
    {
        auto& bytes = block.bytes_;

        for (auto byte = bytes.begin() + SSD1306::OledI2C::DataOffset ; 
             byte != bytes.end() ;
             ++byte)
        {
            if (*byte != value)
            {
                *byte = value;

                if (not block.dirty_)
                {
                    block.dirty_ = true;
                }
            }
        }
    }
}